

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O1

int adiak_workdir(void)

{
  int iVar1;
  int iVar2;
  char cwd [4096];
  char acStack_1008 [4104];
  
  iVar1 = adksys_get_cwd(acStack_1008,0x1000);
  iVar2 = -1;
  if (iVar1 != 1) {
    iVar2 = adiak_namevalue("working_directory",2,"runinfo","%p",acStack_1008);
  }
  return iVar2;
}

Assistant:

int adiak_workdir()
{
   char cwd[FILENAME_MAX];
   int result = adksys_get_cwd(cwd, FILENAME_MAX);
   if (result == 1)
      return -1;
   result = adiak_namevalue("working_directory", adiak_general, "runinfo", "%p", cwd);
   return result;
}